

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O0

void debug_buffer(FILE *fp,bcf_sr_t *reader)

{
  bcf1_t *pbVar1;
  char *pcVar2;
  char *local_58;
  int local_2c;
  int k;
  bcf1_t *line;
  int j;
  bcf_sr_t *reader_local;
  FILE *fp_local;
  
  for (line._4_4_ = 0; line._4_4_ <= reader->nbuffer; line._4_4_ = line._4_4_ + 1) {
    pbVar1 = reader->buffer[line._4_4_];
    pcVar2 = "";
    if (line._4_4_ == 0) {
      pcVar2 = "*";
    }
    if ((*(ulong *)&pbVar1->field_0x10 >> 0x10 & 0xffff) == 0) {
      local_58 = "";
    }
    else {
      local_58 = *(pbVar1->d).allele;
    }
    fprintf((FILE *)fp,"%s%s\t%s:%d\t%s ",reader->fname,pcVar2,
            reader->header->id[1][pbVar1->rid].key,(ulong)(pbVar1->pos + 1),local_58);
    for (local_2c = 1;
        local_2c < (int)((uint)((ulong)*(undefined8 *)&pbVar1->field_0x10 >> 0x10) & 0xffff);
        local_2c = local_2c + 1) {
      fprintf((FILE *)fp," %s",(pbVar1->d).allele[local_2c]);
    }
    fprintf((FILE *)fp,"\n");
  }
  return;
}

Assistant:

void debug_buffer(FILE *fp, bcf_sr_t *reader)
{
    int j;
    for (j=0; j<=reader->nbuffer; j++)
    {
        bcf1_t *line = reader->buffer[j];
        fprintf(fp,"%s%s\t%s:%d\t%s ", reader->fname,j==0?"*":"",reader->header->id[BCF_DT_CTG][line->rid].key,line->pos+1,line->n_allele?line->d.allele[0]:"");
        int k;
        for (k=1; k<line->n_allele; k++) fprintf(fp," %s", line->d.allele[k]);
        fprintf(fp,"\n");
    }
}